

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O3

void qDrawWinPanel(QPainter *p,QRect *r,QPalette *pal,bool sunken,QBrush *fill)

{
  int x;
  int y;
  
  x = (r->x1).m_i;
  y = (r->y1).m_i;
  qDrawWinPanel(p,x,y,((r->x2).m_i - x) + 1,((r->y2).m_i - y) + 1,pal,sunken,fill);
  return;
}

Assistant:

void qDrawWinPanel(QPainter *p, const QRect &r,
                    const QPalette &pal, bool sunken, const QBrush *fill)
{
    qDrawWinPanel(p, r.x(), r.y(), r.width(), r.height(), pal, sunken, fill);
}